

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift.c
# Opt level: O3

rt_function_error_t allocate_shift_local_context(rt_function_t *f)

{
  uint uVar1;
  undefined8 *puVar2;
  rt_variable_t *prVar3;
  long lVar4;
  undefined1 auVar5 [16];
  rt_function_error_t rVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  rt_variable_getter p_Var10;
  rt_variable_setter p_Var11;
  void *pvVar12;
  code *pcVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  rt_list_t src;
  rt_list_t shape;
  rt_list_t shape_00;
  rt_list_t rVar27;
  long lVar23;
  
  rVar6 = RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  if ((f->num_of_inputs == 1) &&
     (rVar6 = RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS, f->num_of_outputs == 1)) {
    piVar9 = (int *)(*rt_malloc_func)(0x70);
    if (piVar9 == (int *)0x0) {
      rVar6 = RT_FUNCTION_ERROR_MALLOC;
    }
    else {
      puVar2 = (undefined8 *)f->local_context;
      *puVar2 = piVar9;
      rVar27._4_4_ = 0;
      rVar27.size = ((*f->inputs)->shape).size;
      rVar27.data = ((*f->inputs)->shape).data;
      rVar27 = clone_list(rVar27);
      *piVar9 = rVar27.size;
      *(int **)(piVar9 + 2) = rVar27.data;
      src._4_4_ = 0;
      src.size = ((*f->outputs)->shape).size;
      src.data = ((*f->outputs)->shape).data;
      rVar27 = clone_list(src);
      piVar9[4] = rVar27.size;
      *(int **)(piVar9 + 6) = rVar27.data;
      shape._4_4_ = 0;
      shape.size = ((*f->inputs)->shape).size;
      shape.data = ((*f->inputs)->shape).data;
      rVar27 = calc_contiguous_strides(shape);
      piVar9[8] = rVar27.size;
      *(int **)(piVar9 + 10) = rVar27.data;
      rVar27 = allocate_list(piVar9[4]);
      piVar9[0xc] = rVar27.size;
      *(int **)(piVar9 + 0xe) = rVar27.data;
      prVar3 = *f->inputs;
      *(rt_variable_t **)(piVar9 + 0x12) = prVar3;
      p_Var10 = select_getter(prVar3);
      *(rt_variable_getter *)(piVar9 + 0x14) = p_Var10;
      prVar3 = *f->outputs;
      *(rt_variable_t **)(piVar9 + 0x16) = prVar3;
      p_Var11 = select_setter(prVar3);
      *(rt_variable_setter *)(piVar9 + 0x18) = p_Var11;
      shape_00._4_4_ = 0;
      shape_00.size = **(uint **)(piVar9 + 0x16);
      shape_00.data = *(int **)(*(uint **)(piVar9 + 0x16) + 2);
      iVar7 = calc_shape_size(shape_00);
      piVar9[0x1a] = iVar7;
      pvVar12 = (*rt_malloc_func)((long)*piVar9 << 3);
      *(void **)(piVar9 + 0x10) = pvVar12;
      if (0 < *piVar9) {
        lVar19 = 0;
        do {
          iVar7 = *(int *)(*(long *)(piVar9 + 10) + lVar19 * 4);
          uVar1 = *(uint *)(*(long *)(piVar9 + 2) + lVar19 * 4);
          pvVar12 = (*rt_malloc_func)((long)(int)uVar1 * 4);
          *(void **)(*(long *)(piVar9 + 0x10) + lVar19 * 8) = pvVar12;
          auVar5 = _DAT_0012fc50;
          uVar14 = (int)lVar19 + (*(int *)(puVar2 + 1) - *piVar9);
          iVar8 = 0;
          if (-1 < (int)uVar14) {
            iVar8 = -*(int *)(puVar2[2] + (ulong)uVar14 * 4);
          }
          if (*(int *)(puVar2 + 3) == 1) {
            if (0 < (int)uVar1) {
              lVar4 = *(long *)(*(long *)(piVar9 + 0x10) + lVar19 * 8);
              uVar18 = 0;
              do {
                uVar14 = 0;
                if (uVar1 != 1) {
                  uVar15 = iVar8 + uVar1 * 2 + (int)uVar18;
                  uVar14 = -uVar15;
                  if (0 < (int)uVar15) {
                    uVar14 = uVar15;
                  }
                  uVar14 = uVar14 % (uVar1 * 2);
                }
                uVar15 = ~uVar14 + uVar1 * 2;
                if ((int)uVar14 < (int)uVar1) {
                  uVar15 = uVar14;
                }
                *(uint *)(lVar4 + uVar18 * 4) = uVar15 * iVar7;
                uVar18 = uVar18 + 1;
              } while (uVar1 != uVar18);
            }
          }
          else if (0 < (int)uVar1) {
            lVar4 = *(long *)(*(long *)(piVar9 + 0x10) + lVar19 * 8);
            iVar17 = uVar1 - 1;
            lVar16 = (ulong)uVar1 - 1;
            auVar20._8_4_ = (int)lVar16;
            auVar20._0_8_ = lVar16;
            auVar20._12_4_ = (int)((ulong)lVar16 >> 0x20);
            auVar21._4_4_ = iVar17;
            auVar21._0_4_ = iVar17;
            auVar21._8_8_ = 0;
            auVar20 = auVar20 ^ _DAT_0012fc50;
            lVar16 = 0;
            auVar22 = _DAT_0012fc40;
            do {
              auVar24 = auVar22 ^ auVar5;
              uVar18 = CONCAT44(-(uint)(0 < iVar8 + 1),-(uint)(0 < iVar8)) &
                       CONCAT44(iVar8 + 1,iVar8);
              auVar25._0_8_ =
                   CONCAT44(-(uint)((int)(uVar18 >> 0x20) < iVar17),-(uint)((int)uVar18 < iVar17));
              auVar25._8_8_ = 0;
              auVar26._8_8_ = 0;
              auVar26._0_8_ = uVar18 & auVar25._0_8_;
              auVar26 = ~auVar25 & auVar21 | auVar26;
              if ((bool)(~(auVar24._4_4_ == auVar20._4_4_ && auVar20._0_4_ < auVar24._0_4_ ||
                          auVar20._4_4_ < auVar24._4_4_) & 1)) {
                *(int *)(lVar4 + lVar16) = auVar26._0_4_ * iVar7;
              }
              if ((auVar24._12_4_ != auVar20._12_4_ || auVar24._8_4_ <= auVar20._8_4_) &&
                  auVar24._12_4_ <= auVar20._12_4_) {
                *(int *)(lVar4 + 4 + lVar16) = auVar26._4_4_ * iVar7;
              }
              lVar23 = auVar22._8_8_;
              auVar22._0_8_ = auVar22._0_8_ + 2;
              auVar22._8_8_ = lVar23 + 2;
              lVar16 = lVar16 + 8;
              iVar8 = iVar8 + 2;
            } while ((ulong)(uVar1 + 1 >> 1) << 3 != lVar16);
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < *piVar9);
      }
      if (((*(byte *)(*(long *)(piVar9 + 0x12) + 0x10) & 0xf) == 0) &&
         ((*(byte *)(*(long *)(piVar9 + 0x16) + 0x10) & 0xf) == 0)) {
        pcVar13 = exec_shift;
      }
      else {
        pcVar13 = exec_shift_generic;
      }
      f->exec_func = pcVar13;
      rVar6 = RT_FUNCTION_ERROR_NOERROR;
    }
  }
  return rVar6;
}

Assistant:

rt_function_error_t allocate_shift_local_context(rt_function_t *f) {
  if (f->num_of_inputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  }
  if (f->num_of_outputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS;
  }

  shift_private_t *p = rt_malloc_func(sizeof(shift_private_t));
  if (p == 0) {
    return RT_FUNCTION_ERROR_MALLOC;
  }
  shift_local_context_t *context = (shift_local_context_t *)(f->local_context);
  ((shift_local_context_t *)(f->local_context))->data = (void *)p;
  p->input_shape = clone_list(f->inputs[0]->shape);
  p->output_shape = clone_list(f->outputs[0]->shape);
  p->input_strides = calc_contiguous_strides(f->inputs[0]->shape);
  p->out_position = allocate_list(p->output_shape.size);
  p->input = f->inputs[0];
  p->get_input = select_getter(p->input);
  p->output = f->outputs[0];
  p->set_output = select_setter(p->output);
  p->output_size = calc_shape_size(p->output->shape);

  p->table = rt_malloc_func(sizeof(int *) * p->input_shape.size);

  for (int i = 0; i < p->input_shape.size; i++) {
    const int stride = p->input_strides.data[i];
    const int size = p->input_shape.data[i];
    p->table[i] = rt_malloc_func(size * sizeof(int));
    const int shift_index = context->shifts.size - p->input_shape.size + i;
    const int shift = shift_index >= 0 ? -context->shifts.data[shift_index] : 0;

    if (context->border_mode == SHIFT_BORDER_MODE_REFLECT) {
      for (int j = 0; j < size; j++) {
        const int a = size > 1 ? (abs(j + size * 2 + shift) % (size * 2)) : 0;
        p->table[i][j] = (a >= size ? (size * 2) - 1 - a : a) * stride;
      }
    } else {
      for (int j = 0; j < size; j++) {
        p->table[i][j] = MIN(MAX(j + shift, 0), size - 1) * stride;
      }
    }
  }
  if (p->input->type == NN_DATA_TYPE_FLOAT &&
      p->output->type == NN_DATA_TYPE_FLOAT) {
#ifdef CONFIG_SHIFT_FLOAT32
    f->exec_func = exec_shift;
#endif /* CONFIG_SHIFT_FLOAT32 */
  } else {
#ifdef CONFIG_SHIFT_GENERIC
    f->exec_func = exec_shift_generic;
#endif /* CONFIG_SHIFT_GENERIC */
  }
  return RT_FUNCTION_ERROR_NOERROR;
}